

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall
wallet::DescriptorScriptPubKeyMan::SetupDescriptorGeneration
          (DescriptorScriptPubKeyMan *this,WalletBatch *batch,CExtKey *master_key,
          OutputType addr_type,bool internal)

{
  byte internal_00;
  byte bVar1;
  bool bVar2;
  undefined1 uVar3;
  runtime_error *prVar4;
  OutputType *in_RDX;
  CExtPubKey *in_RSI;
  long *in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock62;
  WalletDescriptor *in_stack_fffffffffffffcf8;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  WalletDescriptor *in_stack_fffffffffffffd08;
  CExtKey *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined4 in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd1c;
  CKey *in_stack_fffffffffffffd20;
  CExtPubKey *desc_id;
  WalletBatch *in_stack_fffffffffffffd28;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd3f;
  char *__s;
  CExtPubKey *pCVar5;
  bool local_267;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_266;
  CPubKey *in_stack_fffffffffffffdc0;
  CKey *in_stack_fffffffffffffdc8;
  WalletBatch *in_stack_fffffffffffffdd0;
  DescriptorScriptPubKeyMan *in_stack_fffffffffffffdd8;
  undefined1 local_210 [4];
  uint in_stack_fffffffffffffdf4;
  WalletBatch *in_stack_fffffffffffffdf8;
  DescriptorScriptPubKeyMan *in_stack_fffffffffffffe00;
  string local_1d0 [216];
  char local_f8 [240];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  internal_00 = in_R8B & 1;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffcf8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),in_stack_fffffffffffffd30
             ,(char *)in_stack_fffffffffffffd28,&in_stack_fffffffffffffd20->fCompressed,
             in_stack_fffffffffffffd1c,SUB41((uint)in_stack_fffffffffffffd18 >> 0x18,0));
  bVar1 = (**(code **)(*(long *)in_RDI[1] + 0x20))((long *)in_RDI[1],0x400000000);
  if ((bVar1 & 1) == 0) {
    __assert_fail("m_storage.IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x92d,
                  "bool wallet::DescriptorScriptPubKeyMan::SetupDescriptorGeneration(WalletBatch &, const CExtKey &, OutputType, bool)"
                 );
  }
  bVar2 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2> *)
                     in_stack_fffffffffffffcf8);
  if (bVar2) {
    local_267 = false;
  }
  else {
    CExtKey::Neuter(in_stack_fffffffffffffd10);
    GenerateWalletDescriptor(in_RSI,in_RDX,(bool)internal_00);
    __s = local_f8;
    WalletDescriptor::operator=
              (in_stack_fffffffffffffd08,
               (WalletDescriptor *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    WalletDescriptor::~WalletDescriptor(in_stack_fffffffffffffcf8);
    desc_id = in_RSI;
    CKey::GetPubKey(in_stack_fffffffffffffd20);
    uVar3 = AddDescriptorKeyWithDB
                      (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8
                       ,in_stack_fffffffffffffdc0);
    if (((uVar3 ^ 0xff) & 1) != 0) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,__s,
                 (allocator<char> *)CONCAT17(uVar3,in_stack_fffffffffffffd38));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
      std::runtime_error::runtime_error(prVar4,local_1d0);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0167b679;
    }
    pCVar5 = desc_id;
    (**(code **)(*in_RDI + 0xd0))(local_210);
    bVar2 = WalletBatch::WriteDescriptor
                      (in_stack_fffffffffffffd28,(uint256 *)desc_id,
                       (WalletDescriptor *)
                       CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      __lhs = &local_266;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,__s,
                 (allocator<char> *)CONCAT17(uVar3,in_stack_fffffffffffffd38));
      std::operator+(__lhs,(char *)prVar4);
      std::runtime_error::runtime_error(prVar4,(string *)&stack0xfffffffffffffdd0);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0167b679;
    }
    TopUpWithDB(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4);
    (**(code **)(*(long *)in_RDI[1] + 0x28))((long *)in_RDI[1],pCVar5);
    local_267 = true;
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffcf8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_267;
  }
LAB_0167b679:
  __stack_chk_fail();
}

Assistant:

bool DescriptorScriptPubKeyMan::SetupDescriptorGeneration(WalletBatch& batch, const CExtKey& master_key, OutputType addr_type, bool internal)
{
    LOCK(cs_desc_man);
    assert(m_storage.IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS));

    // Ignore when there is already a descriptor
    if (m_wallet_descriptor.descriptor) {
        return false;
    }

    m_wallet_descriptor = GenerateWalletDescriptor(master_key.Neuter(), addr_type, internal);

    // Store the master private key, and descriptor
    if (!AddDescriptorKeyWithDB(batch, master_key.key, master_key.key.GetPubKey())) {
        throw std::runtime_error(std::string(__func__) + ": writing descriptor master private key failed");
    }
    if (!batch.WriteDescriptor(GetID(), m_wallet_descriptor)) {
        throw std::runtime_error(std::string(__func__) + ": writing descriptor failed");
    }

    // TopUp
    TopUpWithDB(batch);

    m_storage.UnsetBlankWalletFlag(batch);
    return true;
}